

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.cc
# Opt level: O3

vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
* __thiscall
cpsm::str_split(vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                *__return_storage_ptr__,cpsm *this,string_ref str,char delimiter)

{
  pointer *ppbVar1;
  iterator iVar2;
  char *pcVar3;
  size_type n;
  basic_string_ref<char,_std::char_traits<char>_> local_48;
  basic_string_ref<char,_std::char_traits<char>_> local_38;
  
  local_48.len_ = (size_t)str.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.ptr_ = (char *)this;
  while( true ) {
    pcVar3 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<boost::detail::string_ref_traits_eq<char,std::char_traits<char>>>>
                       (local_48.ptr_,(char *)(local_48.len_ + (long)local_48.ptr_),(char)str.len_);
    if ((pcVar3 == (char *)(local_48.len_ + (long)local_48.ptr_)) ||
       (n = (long)pcVar3 - (long)local_48.ptr_, n == 0xffffffffffffffff)) break;
    local_38 = boost::basic_string_ref<char,_std::char_traits<char>_>::substr(&local_48,0,n);
    iVar2._M_current =
         (__return_storage_ptr__->
         super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
      ::_M_realloc_insert<boost::basic_string_ref<char,std::char_traits<char>>>
                ((vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,iVar2,&local_38);
    }
    else {
      *(undefined4 *)&(iVar2._M_current)->ptr_ = local_38.ptr_._0_4_;
      *(undefined4 *)((long)&(iVar2._M_current)->ptr_ + 4) = local_38.ptr_._4_4_;
      *(undefined4 *)&(iVar2._M_current)->len_ = (undefined4)local_38.len_;
      *(undefined4 *)((long)&(iVar2._M_current)->len_ + 4) = local_38.len_._4_4_;
      ppbVar1 = &(__return_storage_ptr__->
                 super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    pcVar3 = (char *)(n + 1);
    if (local_48.len_ < (char *)(n + 1)) {
      pcVar3 = (char *)local_48.len_;
    }
    local_48.len_ = local_48.len_ + -(long)pcVar3;
    local_48.ptr_ = pcVar3 + (long)local_48.ptr_;
  }
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
    ::_M_realloc_insert<boost::basic_string_ref<char,std::char_traits<char>>const&>
              ((vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,iVar2,&local_48);
  }
  else {
    (iVar2._M_current)->ptr_ = local_48.ptr_;
    (iVar2._M_current)->len_ = local_48.len_;
    ppbVar1 = &(__return_storage_ptr__->
               super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<boost::string_ref> str_split(boost::string_ref str,
                                         char const delimiter) {
  std::vector<boost::string_ref> splits;
  while (true) {
    auto const dpos = str.find_first_of(delimiter);
    if (dpos == boost::string_ref::npos) {
      break;
    }
    splits.push_back(str.substr(0, dpos));
    str.remove_prefix(dpos+1);
  }
  splits.push_back(str);
  return splits;
}